

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radixsort.c
# Opt level: O0

void init_histograms_u32(uint32_t kRadixBits,uint32_t kHistBuckets,uint32_t kHistSize,uint32_t *hist
                        ,uint32_t *keys_in,uint32_t size)

{
  uint uVar1;
  ulong uVar2;
  uint32_t *offset;
  uint32_t pos;
  uint32_t shift;
  uint32_t bucket;
  uint32_t key;
  uint32_t i;
  uint32_t kHistMask;
  uint32_t size_local;
  uint32_t *keys_in_local;
  uint32_t *hist_local;
  uint32_t kHistSize_local;
  uint32_t kHistBuckets_local;
  uint32_t kRadixBits_local;
  
  for (i = 0; i < size; i = i + 1) {
    uVar1 = keys_in[i];
    for (bucket = 0; bucket < kHistBuckets; bucket = bucket + 1) {
      uVar2 = (ulong)(uVar1 >> ((char)bucket * (char)kRadixBits & 0x1fU) & kHistSize - 1);
      hist[bucket * kHistSize + uVar2] = hist[bucket * kHistSize + uVar2] + 1;
    }
  }
  return;
}

Assistant:

static void init_histograms_u32(uint32_t kRadixBits, uint32_t kHistBuckets, uint32_t kHistSize,
    uint32_t* restrict hist, const uint32_t* restrict keys_in, uint32_t size)
{
    const uint32_t kHistMask = kHistSize - 1;
    for (uint32_t i = 0; i < size; ++i)
    {
        const uint32_t key = keys_in[i];
        for (uint32_t bucket = 0; bucket < kHistBuckets; ++bucket)
        {
            const uint32_t shift = bucket * kRadixBits;
            const uint32_t pos = (key >> shift) & kHistMask;
            uint32_t* offset = hist + (bucket * kHistSize);
            ++offset[pos];
        }
    }
}